

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
 __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
::
internal_find_unique<S2Loop*,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>const,std::pair<S2Loop*const,std::pair<int,bool>>const&,std::pair<S2Loop*const,std::pair<int,bool>>const*>>
          (btree<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
           *this,S2Loop **key,
          btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
          iter)

{
  undefined8 x;
  int iVar1;
  bool bVar2;
  key_type *y;
  undefined8 extraout_RDX;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
  iter_00;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
  bVar3;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
  bVar4;
  undefined1 auStack_58 [8];
  pair<gtl::internal_btree::btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>,_int>
  res;
  const_lookup_key_reference<S2Loop_*> lookup_key;
  S2Loop **key_local;
  btree<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
  *this_local;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
  iter_local;
  int local_10;
  
  iVar1 = local_10;
  this_local = (btree<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                *)iter.node;
  iter_local.node._0_4_ = iter.position;
  res._16_8_ = key;
  if (this_local !=
      (btree<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
       *)0x0) {
    bVar3._12_4_ = 0;
    bVar3.node = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                  *)SUB128(iter._0_12_,0);
    bVar3.position = SUB124(iter._0_12_,8);
    internal_locate<S2Loop*,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>const,std::pair<S2Loop*const,std::pair<int,bool>>const&,std::pair<S2Loop*const,std::pair<int,bool>>const*>>
              ((pair<gtl::internal_btree::btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>,_int>
                *)auStack_58,this,key,bVar3);
    local_10 = (int)res.first.node;
    if (res.first.position == 0x40000000) {
      iter_local._8_8_ = auStack_58;
      goto LAB_0043f959;
    }
    if (res.first.position == 0) {
      iter_00.node = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                      *)((ulong)res.first.node & 0xffffffff);
      iter_00._8_8_ = extraout_RDX;
      bVar3 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>const,std::pair<S2Loop*const,std::pair<int,bool>>const&,std::pair<S2Loop*const,std::pair<int,bool>>const*>>
                        ((btree<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
                          *)auStack_58,iter_00);
      x = res._16_8_;
      this_local = (btree<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                    *)bVar3.node;
      iter_local.node._0_4_ = bVar3.position;
      if (this_local !=
          (btree<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
           *)0x0) {
        y = btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
            ::key((btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
                   *)&this_local);
        bVar2 = compare_keys<S2Loop*,S2Loop*>(this,(S2Loop **)x,y);
        if (!bVar2) {
          iter_local._8_8_ = this_local;
          local_10 = (int)iter_local.node;
          goto LAB_0043f959;
        }
      }
    }
  }
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
  ::btree_iterator((btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
                    *)&iter_local.position,
                   (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                    *)0x0,0);
  local_10 = iVar1;
LAB_0043f959:
  bVar4.position = local_10;
  bVar4.node = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                *)iter_local._8_8_;
  bVar4._12_4_ = 0;
  return bVar4;
}

Assistant:

IterType btree<P>::internal_find_unique(
    const K &key, IterType iter) const {
  const_lookup_key_reference<K> lookup_key(key);
  if (iter.node) {
    std::pair<IterType, int> res = internal_locate(lookup_key, iter);
    if (res.second == kExactMatch) {
      return res.first;
    }
    if (!res.second) {
      iter = internal_last(res.first);
      if (iter.node && !compare_keys(lookup_key, iter.key())) {
        return iter;
      }
    }
  }
  return IterType(nullptr, 0);
}